

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib521.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 != 0) {
      iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
      if (iVar1 == 0) {
        lVar3 = strtol(libtest_arg2,(char **)0x0,10);
        iVar1 = curl_easy_setopt(lVar2,3,lVar3);
        if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x2715,"xxx:yyy"), iVar1 == 0)) &&
           (iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 == 0)) {
          iVar1 = curl_easy_perform(lVar2);
        }
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_PORT, strtol(libtest_arg2, NULL, 10));
  test_setopt(curl, CURLOPT_USERPWD, "xxx:yyy");
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  res = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}